

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

int __thiscall LinkedObjectFile::get_label_at(LinkedObjectFile *this,int seg,int offset)

{
  pointer puVar1;
  __node_base_ptr p_Var2;
  int iVar3;
  _Hash_node_base _Var4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  
  uVar7 = (ulong)seg;
  puVar1 = (this->label_per_seg_by_offset).
           super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->label_per_seg_by_offset).
                 super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar5 = puVar1[uVar7]._M_h._M_bucket_count;
  uVar6 = (ulong)(long)offset % uVar5;
  p_Var2 = puVar1[uVar7]._M_h._M_buckets[uVar6];
  p_Var9 = (_Hash_node_base *)0x0;
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (_Var4._M_nxt = p_Var2->_M_nxt, p_Var9 = p_Var2, *(int *)&p_Var2->_M_nxt[1]._M_nxt != offset))
  {
    while (p_Var8 = _Var4._M_nxt, _Var4._M_nxt = p_Var8->_M_nxt,
          _Var4._M_nxt != (_Hash_node_base *)0x0) {
      p_Var9 = (_Hash_node_base *)0x0;
      if (((ulong)(long)*(int *)&_Var4._M_nxt[1]._M_nxt % uVar5 != uVar6) ||
         (p_Var9 = p_Var8, *(int *)&_Var4._M_nxt[1]._M_nxt == offset)) goto LAB_0012e238;
    }
    p_Var9 = (_Hash_node_base *)0x0;
  }
LAB_0012e238:
  if (p_Var9 == (_Hash_node_base *)0x0) {
    _Var4._M_nxt = (_Hash_node_base *)0x0;
  }
  else {
    _Var4._M_nxt = p_Var9->_M_nxt;
  }
  if (_Var4._M_nxt == (_Hash_node_base *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = *(int *)((long)(_Var4._M_nxt + 1) + 4);
  }
  return iVar3;
}

Assistant:

int LinkedObjectFile::get_label_at(int seg, int offset) const {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    return -1;
  }

  return kv->second;
}